

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall leveldb::CorruptionTest::Build(CorruptionTest *this,int n)

{
  int i;
  undefined1 local_24d;
  int local_24c;
  Status local_248;
  Slice key;
  WriteBatch batch;
  string value_space;
  string key_space;
  Slice local_1d0;
  
  key_space._M_dataplus._M_p = (pointer)&key_space.field_2;
  key_space._M_string_length = 0;
  i = 0;
  key_space.field_2._M_local_buf[0] = '\0';
  value_space._M_dataplus._M_p = (pointer)&value_space.field_2;
  value_space._M_string_length = 0;
  value_space.field_2._M_local_buf[0] = '\0';
  WriteBatch::WriteBatch(&batch);
  local_24c = n + -1;
  if (n < 1) {
    n = 0;
  }
  for (; n != i; i = i + 1) {
    key = Key(this,i,&key_space);
    WriteBatch::Clear(&batch);
    local_1d0 = Value(this,i,&value_space);
    WriteBatch::Put(&batch,&key,&local_1d0);
    local_24d = local_24c == i;
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
               ,0x47);
    (*this->db_->_vptr_DB[4])(&local_248,this->db_,&local_24d,&batch);
    test::Tester::IsOk((Tester *)&local_1d0,&local_248);
    Status::~Status(&local_248);
    test::Tester::~Tester((Tester *)&local_1d0);
  }
  WriteBatch::~WriteBatch(&batch);
  std::__cxx11::string::~string((string *)&value_space);
  std::__cxx11::string::~string((string *)&key_space);
  return;
}

Assistant:

void Build(int n) {
    std::string key_space, value_space;
    WriteBatch batch;
    for (int i = 0; i < n; i++) {
      // if ((i % 100) == 0) fprintf(stderr, "@ %d of %d\n", i, n);
      Slice key = Key(i, &key_space);
      batch.Clear();
      batch.Put(key, Value(i, &value_space));
      WriteOptions options;
      // Corrupt() doesn't work without this sync on windows; stat reports 0 for
      // the file size.
      if (i == n - 1) {
        options.sync = true;
      }
      ASSERT_OK(db_->Write(options, &batch));
    }
  }